

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O3

string * __thiscall
HawkTracer::client::TracepointMap::category_to_string_abi_cxx11_
          (string *__return_storage_ptr__,TracepointMap *this,Category category)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 2) {
    pcVar2 = "native";
    pcVar1 = "";
  }
  else if ((int)this == 1) {
    pcVar2 = "lua";
    pcVar1 = "";
  }
  else {
    pcVar2 = "default";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TracepointMap::category_to_string(Category category)
{
    switch (category)
    {
    case Lua:
        return "lua";
    case Native:
        return "native";
    default:
        return "default";
    }
}